

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  int iVar1;
  size_t n;
  mbedtls_mpi_uint **ppmVar2;
  size_t *psVar3;
  mbedtls_mpi TB;
  mbedtls_mpi local_48;
  
  iVar1 = mbedtls_mpi_cmp_abs(A,B);
  if (iVar1 < 0) {
    return -10;
  }
  psVar3 = &local_48.n;
  local_48.s = 1;
  local_48.n = 0;
  local_48.p = (mbedtls_mpi_uint *)0x0;
  if (X == B) {
    iVar1 = mbedtls_mpi_copy(&local_48,B);
    if (iVar1 != 0) goto LAB_00163d11;
    ppmVar2 = &local_48.p;
  }
  else {
    ppmVar2 = &B->p;
    psVar3 = &B->n;
  }
  if ((X == A) || (iVar1 = mbedtls_mpi_copy(X,A), iVar1 == 0)) {
    X->s = 1;
    n = *psVar3;
    if (n != 0) {
      do {
        if ((*ppmVar2)[n - 1] != 0) goto LAB_00163ce8;
        n = n - 1;
      } while (n != 0);
      n = 0;
    }
LAB_00163ce8:
    mpi_sub_hlp(n,*ppmVar2,X->p);
    iVar1 = 0;
  }
LAB_00163d11:
  mbedtls_mpi_free(&local_48);
  return iVar1;
}

Assistant:

int mbedtls_mpi_sub_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    mbedtls_mpi TB;
    int ret;
    size_t n;

    if( mbedtls_mpi_cmp_abs( A, B ) < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    mbedtls_mpi_init( &TB );

    if( X == B )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &TB, B ) );
        B = &TB;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned subtractions.
     */
    X->s = 1;

    ret = 0;

    for( n = B->n; n > 0; n-- )
        if( B->p[n - 1] != 0 )
            break;

    mpi_sub_hlp( n, B->p, X->p );

cleanup:

    mbedtls_mpi_free( &TB );

    return( ret );
}